

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.hpp
# Opt level: O0

void __thiscall ruckig::BrakeProfile::finalize(BrakeProfile *this,double *ps,double *vs,double *as)

{
  value_type_conflict2 vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  reference pvVar6;
  tuple<double_&,_double_&,_double_&> local_88;
  tuple<double,_double,_double> local_70;
  tuple<double_&,_double_&,_double_&> local_58;
  tuple<double,_double,_double> local_40;
  double *local_28;
  double *as_local;
  double *vs_local;
  double *ps_local;
  BrakeProfile *this_local;
  
  local_28 = as;
  as_local = vs;
  vs_local = ps;
  ps_local = &this->duration;
  pvVar6 = std::array<double,_2UL>::operator[](&this->t,0);
  if ((*pvVar6 <= 0.0) && (pvVar6 = std::array<double,_2UL>::operator[](&this->t,1), *pvVar6 <= 0.0)
     ) {
    this->duration = 0.0;
    return;
  }
  pvVar6 = std::array<double,_2UL>::operator[](&this->t,0);
  this->duration = *pvVar6;
  vVar1 = *vs_local;
  pvVar6 = std::array<double,_2UL>::operator[](&this->p,0);
  *pvVar6 = vVar1;
  vVar1 = *as_local;
  pvVar6 = std::array<double,_2UL>::operator[](&this->v,0);
  *pvVar6 = vVar1;
  dVar2 = *local_28;
  pvVar6 = std::array<double,_2UL>::operator[](&this->a,0);
  *pvVar6 = dVar2;
  pvVar6 = std::array<double,_2UL>::operator[](&this->t,0);
  dVar2 = *pvVar6;
  dVar3 = *vs_local;
  dVar4 = *as_local;
  dVar5 = *local_28;
  pvVar6 = std::array<double,_2UL>::operator[](&this->j,0);
  integrate(&local_40,dVar2,dVar3,dVar4,dVar5,*pvVar6);
  std::tie<double,double,double>(&local_58,vs_local,as_local,local_28);
  std::tuple<double&,double&,double&>::operator=
            ((tuple<double&,double&,double&> *)&local_58,&local_40);
  pvVar6 = std::array<double,_2UL>::operator[](&this->t,1);
  if (0.0 < *pvVar6) {
    pvVar6 = std::array<double,_2UL>::operator[](&this->t,1);
    this->duration = *pvVar6 + this->duration;
    vVar1 = *vs_local;
    pvVar6 = std::array<double,_2UL>::operator[](&this->p,1);
    *pvVar6 = vVar1;
    vVar1 = *as_local;
    pvVar6 = std::array<double,_2UL>::operator[](&this->v,1);
    *pvVar6 = vVar1;
    dVar2 = *local_28;
    pvVar6 = std::array<double,_2UL>::operator[](&this->a,1);
    *pvVar6 = dVar2;
    pvVar6 = std::array<double,_2UL>::operator[](&this->t,1);
    dVar2 = *pvVar6;
    dVar3 = *vs_local;
    dVar4 = *as_local;
    dVar5 = *local_28;
    pvVar6 = std::array<double,_2UL>::operator[](&this->j,1);
    integrate(&local_70,dVar2,dVar3,dVar4,dVar5,*pvVar6);
    std::tie<double,double,double>(&local_88,vs_local,as_local,local_28);
    std::tuple<double&,double&,double&>::operator=
              ((tuple<double&,double&,double&> *)&local_88,&local_70);
  }
  return;
}

Assistant:

void finalize(double& ps, double& vs, double& as) {
        if (t[0] <= 0.0 && t[1] <= 0.0) {
            duration = 0.0;
            return;
        }

        duration = t[0];
        p[0] = ps;
        v[0] = vs;
        a[0] = as;
        std::tie(ps, vs, as) = integrate(t[0], ps, vs, as, j[0]);

        if (t[1] > 0.0) {
            duration += t[1];
            p[1] = ps;
            v[1] = vs;
            a[1] = as;
            std::tie(ps, vs, as) = integrate(t[1], ps, vs, as, j[1]);
        }
    }